

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_kernel clCreateKernel(cl_program program,char *kernel_name,cl_int *errcode_ret)

{
  bool bVar1;
  CLIntercept *this;
  cl_icd_dispatch *pcVar2;
  SConfig *pSVar3;
  uint *in_RDX;
  cl_program in_RSI;
  string *in_RDI;
  cl_uint in_stack_00000044;
  cl_kernel *in_stack_00000048;
  CLIntercept *in_stack_00000050;
  cl_int in_stack_00000074;
  char *in_stack_00000078;
  CLIntercept *in_stack_00000080;
  cl_kernel retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe60;
  CLIntercept *in_stack_fffffffffffffe68;
  _cl_kernel *in_stack_fffffffffffffe70;
  CObjectTracker *in_stack_fffffffffffffe78;
  cl_program p_Var4;
  string *in_stack_fffffffffffffeb8;
  cl_program in_stack_fffffffffffffec0;
  allocator *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  cl_program in_stack_fffffffffffffed8;
  CLIntercept *in_stack_fffffffffffffee0;
  uint64_t in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff08;
  CLIntercept *in_stack_ffffffffffffff10;
  time_point in_stack_ffffffffffffff18;
  time_point in_stack_ffffffffffffff20;
  time_point in_stack_ffffffffffffff28;
  allocator local_b9;
  string local_b8 [32];
  rep local_98;
  allocator local_79;
  string local_78 [32];
  cl_kernel local_58;
  string *local_50;
  time_point local_48;
  string *local_40;
  uint local_34;
  uint64_t local_30;
  string *psVar5;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch(this), pcVar2->clCreateKernel == (cl_api_clCreateKernel)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffed0)
    ;
    if (in_RDX != (uint *)0x0) {
      *in_RDX = 0xffffffd4;
    }
    local_58 = (cl_kernel)0x0;
  }
  else {
    local_30 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffe68);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingEnter
                (this,"clCreateKernel",local_30,(cl_kernel)0x0,"program = %p, kernel_name = %s",
                 in_RDI,in_RSI);
    }
    local_34 = 0;
    pSVar3 = CLIntercept::config(this);
    if ((((((pSVar3->CallLogging & 1U) != 0) ||
          (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorLogging & 1U) != 0)) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) &&
       (in_RDX == (uint *)0x0)) {
      in_RDX = &local_34;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe60);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffe60);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      local_50 = (string *)std::chrono::_V2::steady_clock::now();
      local_40 = local_50;
    }
    local_58 = (cl_kernel)0x0;
    pSVar3 = CLIntercept::config(this);
    p_Var4 = in_RSI;
    psVar5 = in_RDI;
    if ((pSVar3->OverrideBuiltinKernels & 1U) != 0) {
      in_stack_fffffffffffffec8 = &local_79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,(char *)in_RSI,in_stack_fffffffffffffec8);
      local_58 = CLIntercept::createBuiltinKernel
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                            (string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (cl_int *)in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      in_stack_fffffffffffffeb8 = in_RDI;
      in_stack_fffffffffffffec0 = in_RSI;
    }
    if (local_58 == (cl_kernel)0x0) {
      pcVar2 = CLIntercept::dispatch(this);
      local_58 = (*pcVar2->clCreateKernel)((cl_program)psVar5,(char *)p_Var4,(cl_int *)in_RDX);
    }
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      local_98 = std::chrono::_V2::steady_clock::now();
      local_48.__d.__r = (duration)(duration)local_98;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,local_30), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"",&local_b9);
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff20.__d.__r,
                   (char *)in_stack_ffffffffffffff18.__d.__r,(string *)in_stack_ffffffffffffff10,
                   local_48,in_stack_ffffffffffffff28);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (*in_RDX != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000080,in_stack_00000078,in_stack_00000074);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        *in_RDX = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->LeakChecking & 1U) != 0) {
      CLIntercept::objectTracker(this);
      CObjectTracker::AddAllocation<_cl_kernel*>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (this,"clCreateKernel",(cl_int)(ulong)*in_RDX,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",local_58);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff10,"",(allocator *)&stack0xffffffffffffff0f);
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,local_40,local_48.__d.__r._7_1_
                 ,in_stack_fffffffffffffef0,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
    }
    if (local_58 != (cl_kernel)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffed8,(char *)p_Var4,
                 (allocator *)&stack0xfffffffffffffed7);
      CLIntercept::addKernelInfo
                ((CLIntercept *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (cl_kernel)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->KernelInfoLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this),
         (pSVar3->PreferredWorkGroupSizeMultipleLogging & 1U) != 0)) {
        CLIntercept::logKernelInfo(in_stack_00000050,in_stack_00000048,in_stack_00000044);
      }
    }
  }
  return local_58;
}

Assistant:

CL_API_ENTRY cl_kernel CL_API_CALL CLIRN(clCreateKernel)(
    cl_program program,
    const char* kernel_name,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clCreateKernel )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "program = %p, kernel_name = %s",
            program,
            kernel_name );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_kernel   retVal = NULL;

        if( ( retVal == NULL ) &&
            pIntercept->config().OverrideBuiltinKernels )
        {
            retVal = pIntercept->createBuiltinKernel(
                program,
                kernel_name,
                errcode_ret );
        }

        if( retVal == NULL )
        {
            retVal = pIntercept->dispatch().clCreateKernel(
                program,
                kernel_name,
                errcode_ret );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        if( retVal != NULL )
        {
            pIntercept->addKernelInfo(
                retVal,
                program,
                kernel_name );
            if( pIntercept->config().KernelInfoLogging ||
                pIntercept->config().PreferredWorkGroupSizeMultipleLogging )
            {
                pIntercept->logKernelInfo(
                    &retVal,
                    1 );
            }
        }

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_PROGRAM);
}